

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  SingleVertexArrayOffsetGroup *this_00;
  long lVar1;
  
  lVar1 = 0;
  do {
    this_00 = (SingleVertexArrayOffsetGroup *)operator_new(0x80);
    SingleVertexArrayOffsetGroup::SingleVertexArrayOffsetGroup
              (this_00,(this->super_TestCaseGroup).m_context,
               *(InputType *)((long)&DAT_01bf398c + lVar1));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  return extraout_EAX;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test offset with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayOffsetGroup(m_context, inputTypes[inputTypeNdx]));
	}
}